

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

void __thiscall
AlignmentRecord::mergeAlignmentRecordsMixed(AlignmentRecord *this,AlignmentRecord *ar)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  ShortDnaSequence *pSVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  int *piVar8;
  uint uVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  AlignmentRecord *pAVar11;
  size_type sVar12;
  int ref_p_s_pos1;
  int ref_s_pos1;
  int local_168;
  int ref_rel_pos1;
  int c_pos1;
  int q_pos1;
  uint local_158;
  int c_p_pos2;
  int q_p_pos2;
  int q_p_pos1;
  undefined8 local_148;
  vector<char,_std::allocator<char>_> *local_140;
  int c_p_pos1;
  vector<char,_std::allocator<char>_> *local_130;
  string qualities;
  string dna;
  string ref;
  string nucigar;
  string algn;
  char i;
  vector<char,_std::allocator<char>_> *local_38;
  
  dna._M_dataplus._M_p = (pointer)&dna.field_2;
  if (ar->single_end != true) {
    dna._M_string_length = 0;
    dna.field_2._M_local_buf[0] = '\0';
    qualities._M_dataplus._M_p = (pointer)&qualities.field_2;
    qualities._M_string_length = 0;
    qualities.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&nucigar,"",(allocator *)&i);
    std::__cxx11::string::string((string *)&ref,"",(allocator *)&i);
    std::__cxx11::string::string((string *)&algn,"",(allocator *)&i);
    pvVar1 = &this->cigar1_unrolled;
    iVar4 = computeOffset(pvVar1);
    local_140 = pvVar1;
    iVar5 = computeRevOffset(pvVar1);
    local_130 = (vector<char,_std::allocator<char>_> *)CONCAT44(local_130._4_4_,iVar5);
    pvVar1 = &ar->cigar1_unrolled;
    iVar5 = computeOffset(pvVar1);
    local_38 = pvVar1;
    computeRevOffset(pvVar1);
    pvVar1 = &ar->cigar2_unrolled;
    iVar6 = computeRevOffset(pvVar1);
    iVar4 = this->start1 - iVar4;
    local_158 = this->end1;
    iVar5 = ar->start1 - iVar5;
    local_148 = CONCAT44(local_148._4_4_,iVar6 + ar->end2);
    q_pos1 = 0;
    q_p_pos1 = 0;
    q_p_pos2 = 0;
    c_pos1 = 0;
    c_p_pos1 = 0;
    c_p_pos2 = 0;
    ref_rel_pos1 = 0;
    local_168 = 0;
    ref_p_s_pos1 = iVar5;
    ref_s_pos1 = iVar4;
    if (local_158 < ar->start2) {
      mergeAlignmentRecordsSingle(this,ar,1,1);
      uVar9 = ar->end2;
      this->start2 = ar->start2;
      this->end2 = uVar9;
      this->single_end = false;
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                (&this->cigar2,&ar->cigar2);
      ShortDnaSequence::operator=(&this->sequence2,&ar->sequence2);
      this->phred_sum2 = ar->phred_sum2;
      iVar4 = ar->length_incl_longdeletions2;
      this->length_incl_deletions2 = ar->length_incl_deletions2;
      this->length_incl_longdeletions2 = iVar4;
      std::vector<char,_std::allocator<char>_>::operator=(&this->cigar2_unrolled,pvVar1);
      std::__cxx11::string::string((string *)&i,(string *)&ar->reference_seq2);
      std::__cxx11::string::operator=((string *)&this->reference_seq2,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::string::string((string *)&i,(string *)&ar->alignSequence2);
      std::__cxx11::string::operator=((string *)&this->alignSequence2,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&i,&ar->qualityList2);
      pvVar10 = &this->qualityList2;
    }
    else {
      if (this->start1 <= ar->end1) {
        local_158 = local_158 + (int)local_130;
        if (iVar5 < iVar4) {
          while (ref_p_s_pos1 < iVar4) {
            noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_p_pos1,&q_p_pos1,&ref_p_s_pos1,
                           &local_168,1);
          }
          local_130 = (vector<char,_std::allocator<char>_> *)0x1;
          while ((uint)ref_p_s_pos1 <= ar->end1) {
            overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_pos1,&c_p_pos1,&q_pos1,
                         &q_p_pos1,&ref_p_s_pos1,&ref_rel_pos1,1,1);
          }
          while ((uint)ref_p_s_pos1 < ar->start2) {
            noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_p_s_pos1,
                           &ref_rel_pos1,1);
          }
          computeSOffset(pvVar1,&c_p_pos2,&q_p_pos2);
          uVar9 = local_158;
          if ((int)(uint)local_148 < (int)local_158) {
            uVar9 = (uint)local_148;
          }
          while (ref_p_s_pos1 <= (int)uVar9) {
            overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_pos1,&c_p_pos2,&q_pos1,
                         &q_p_pos2,&ref_p_s_pos1,&ref_rel_pos1,1,2);
          }
          local_168 = ref_rel_pos1 + -1;
          if (ref_p_s_pos1 - 1U == (uint)local_148) {
            while (ref_p_s_pos1 <= (int)local_158) {
              noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_p_s_pos1,
                             &ref_rel_pos1,1);
            }
            piVar8 = &ref_rel_pos1;
            pAVar11 = this;
LAB_0018c5cd:
            updateReference(pAVar11,&ref,(int)local_130,*piVar8);
          }
          else if (ref_p_s_pos1 - 1U == local_158) {
            local_130 = (vector<char,_std::allocator<char>_> *)0x2;
            while (ref_p_s_pos1 <= (int)(uint)local_148) {
              noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_p_pos2,&q_p_pos2,
                             &ref_p_s_pos1,&local_168,2);
            }
            piVar8 = &local_168;
            pAVar11 = ar;
            goto LAB_0018c5cd;
          }
          uVar9 = this->start1;
          if (ar->start1 < this->start1) {
            uVar9 = ar->start1;
          }
          this->start1 = uVar9;
          uVar9 = this->end1;
          if (this->end1 < ar->end2) {
            uVar9 = ar->end2;
          }
          this->end1 = uVar9;
          this->single_end = true;
          createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i,&nucigar);
          std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::_M_move_assign
                    (&this->cigar1,
                     (_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i);
          std::_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~_Vector_base
                    ((_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i);
          ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&i,&dna,&qualities);
          pSVar2 = &this->sequence1;
          ShortDnaSequence::operator=(pSVar2,(ShortDnaSequence *)&i);
          ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&i);
          iVar4 = phred_sum(&qualities,'!');
          this->phred_sum1 = iVar4;
          sVar7 = ShortDnaSequence::size(pSVar2);
          this->length_incl_deletions1 = (int)sVar7;
          sVar7 = ShortDnaSequence::size(pSVar2);
          this->length_incl_longdeletions1 = (int)sVar7;
          pcVar3 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish != pcVar3) {
            (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = pcVar3;
          }
          for (sVar12 = 0; nucigar._M_string_length != sVar12; sVar12 = sVar12 + 1) {
            i = nucigar._M_dataplus._M_p[sVar12];
            std::vector<char,_std::allocator<char>_>::push_back(local_140,&i);
          }
        }
        else {
          piVar8 = &ref_rel_pos1;
          while (ref_s_pos1 < iVar5) {
            noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                           piVar8,1);
          }
          local_130 = (vector<char,_std::allocator<char>_> *)0x1;
          while ((uint)ref_s_pos1 <= ar->end1) {
            overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_pos1,&c_p_pos1,&q_pos1,
                         &q_p_pos1,&ref_s_pos1,piVar8,1,1);
          }
          while ((uint)ref_s_pos1 < ar->start2) {
            noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                           piVar8,1);
          }
          local_38 = (vector<char,_std::allocator<char>_> *)CONCAT44(local_38._4_4_,ref_rel_pos1);
          computeSOffset(pvVar1,&c_p_pos2,&q_p_pos2);
          uVar9 = local_158;
          if ((int)(uint)local_148 < (int)local_158) {
            uVar9 = (uint)local_148;
          }
          while (ref_s_pos1 <= (int)uVar9) {
            overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_pos1,&c_p_pos2,&q_pos1,
                         &q_p_pos2,&ref_s_pos1,piVar8,1,2);
          }
          local_168 = ref_rel_pos1 - (int)local_38;
          if (ref_s_pos1 - 1U == (uint)local_148) {
            while (pAVar11 = this, ref_s_pos1 <= (int)local_158) {
              noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                             piVar8,1);
            }
LAB_0018c894:
            updateReference(pAVar11,&ref,(int)local_130,*piVar8);
          }
          else if (ref_s_pos1 - 1U == local_158) {
            piVar8 = &local_168;
            local_130 = (vector<char,_std::allocator<char>_> *)0x2;
            while (pAVar11 = ar, ref_s_pos1 <= (int)(uint)local_148) {
              noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_p_pos2,&q_p_pos2,&ref_s_pos1,
                             piVar8,2);
            }
            goto LAB_0018c894;
          }
          uVar9 = this->start1;
          if (ar->start1 < this->start1) {
            uVar9 = ar->start1;
          }
          this->start1 = uVar9;
          uVar9 = this->end1;
          if (this->end1 < ar->end2) {
            uVar9 = ar->end2;
          }
          this->end1 = uVar9;
          this->single_end = true;
          createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i,&nucigar);
          std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::_M_move_assign
                    (&this->cigar1,
                     (_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i);
          std::_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~_Vector_base
                    ((_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i);
          ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&i,&dna,&qualities);
          pSVar2 = &this->sequence1;
          ShortDnaSequence::operator=(pSVar2,(ShortDnaSequence *)&i);
          ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&i);
          iVar4 = phred_sum(&qualities,'!');
          this->phred_sum1 = iVar4;
          sVar7 = ShortDnaSequence::size(pSVar2);
          this->length_incl_deletions1 = (int)sVar7;
          sVar7 = ShortDnaSequence::size(pSVar2);
          this->length_incl_longdeletions1 = (int)sVar7;
          pcVar3 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish != pcVar3) {
            (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = pcVar3;
          }
          for (sVar12 = 0; nucigar._M_string_length != sVar12; sVar12 = sVar12 + 1) {
            i = nucigar._M_dataplus._M_p[sVar12];
            std::vector<char,_std::allocator<char>_>::push_back(local_140,&i);
          }
        }
        std::__cxx11::string::_M_assign((string *)&this->reference_seq1);
        std::__cxx11::string::_M_assign((string *)&this->alignSequence1);
        std::vector<int,std::allocator<int>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((vector<int,std::allocator<int>> *)&this->qualityList1,qualities._M_dataplus._M_p
                   ,qualities._M_dataplus._M_p + qualities._M_string_length);
        goto LAB_0018c844;
      }
      mergeAlignmentRecordsSingle(this,ar,1,2);
      uVar9 = ar->end1;
      this->start1 = ar->start1;
      this->end1 = uVar9;
      this->single_end = false;
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                (&this->cigar1,&ar->cigar1);
      ShortDnaSequence::operator=(&this->sequence1,&ar->sequence1);
      this->phred_sum1 = ar->phred_sum1;
      iVar4 = ar->length_incl_longdeletions1;
      this->length_incl_deletions1 = ar->length_incl_deletions1;
      this->length_incl_longdeletions1 = iVar4;
      std::vector<char,_std::allocator<char>_>::operator=(local_140,local_38);
      std::__cxx11::string::string((string *)&i,(string *)&ar->reference_seq1);
      std::__cxx11::string::operator=((string *)&this->reference_seq1,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::string::string((string *)&i,(string *)&ar->alignSequence1);
      std::__cxx11::string::operator=((string *)&this->alignSequence1,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&i,&ar->qualityList1);
      pvVar10 = &this->qualityList1;
    }
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (pvVar10,(_Vector_base<int,_std::allocator<int>_> *)&i);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&i);
    goto LAB_0018c844;
  }
  dna._M_string_length = 0;
  dna.field_2._M_local_buf[0] = '\0';
  qualities._M_dataplus._M_p = (pointer)&qualities.field_2;
  qualities._M_string_length = 0;
  qualities.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&nucigar,"",(allocator *)&i);
  std::__cxx11::string::string((string *)&ref,"",(allocator *)&i);
  std::__cxx11::string::string((string *)&algn,"",(allocator *)&i);
  iVar4 = computeOffset(&ar->cigar1_unrolled);
  iVar5 = computeRevOffset(&ar->cigar1_unrolled);
  local_148 = CONCAT44(local_148._4_4_,iVar5);
  pvVar1 = &this->cigar1_unrolled;
  iVar5 = computeOffset(pvVar1);
  local_130 = pvVar1;
  computeRevOffset(pvVar1);
  pvVar1 = &this->cigar2_unrolled;
  iVar6 = computeRevOffset(pvVar1);
  iVar4 = ar->start1 - iVar4;
  uVar9 = ar->end1;
  iVar5 = this->start1 - iVar5;
  local_158 = iVar6 + this->end2;
  q_pos1 = 0;
  q_p_pos1 = 0;
  q_p_pos2 = 0;
  c_pos1 = 0;
  c_p_pos1 = 0;
  c_p_pos2 = 0;
  ref_rel_pos1 = 0;
  local_168 = 0;
  local_140 = (vector<char,_std::allocator<char>_> *)CONCAT44(local_140._4_4_,uVar9);
  ref_p_s_pos1 = iVar5;
  ref_s_pos1 = iVar4;
  if (uVar9 < this->start2) {
    mergeAlignmentRecordsSingle(this,ar,1,1);
    this->single_end = false;
    goto LAB_0018c844;
  }
  if (this->end1 < ar->start1) {
    mergeAlignmentRecordsSingle(this,ar,2,1);
    goto LAB_0018c844;
  }
  local_140 = (vector<char,_std::allocator<char>_> *)
              CONCAT44(local_140._4_4_,uVar9 + (uint)local_148);
  if (iVar5 < iVar4) {
    piVar8 = &ref_rel_pos1;
    while (iVar5 = ref_rel_pos1, ref_p_s_pos1 < iVar4) {
      noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_p_pos1,&q_p_pos1,&ref_p_s_pos1,
                     piVar8,1);
    }
    local_148 = 1;
    while ((uint)ref_p_s_pos1 <= this->end1) {
      overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_p_pos1,&c_pos1,&q_p_pos1,&q_pos1,
                   &ref_p_s_pos1,piVar8,1,1);
    }
    local_168 = ref_rel_pos1 - iVar5;
    while ((uint)ref_p_s_pos1 < this->start2) {
      noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_p_s_pos1,&local_168
                     ,1);
    }
    ref_rel_pos1 = 0;
    computeSOffset(pvVar1,&c_p_pos2,&q_p_pos2);
    uVar9 = (uint)local_140;
    if ((int)local_158 < (int)(uint)local_140) {
      uVar9 = local_158;
    }
    while (ref_p_s_pos1 <= (int)uVar9) {
      overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_p_pos2,&c_pos1,&q_p_pos2,&q_pos1,
                   &ref_p_s_pos1,piVar8,2,1);
    }
    local_168 = ref_rel_pos1 + local_168 + -1;
    if (ref_p_s_pos1 - 1U == local_158) {
      while (ref_p_s_pos1 <= (int)(uint)local_140) {
        noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_p_s_pos1,
                       &local_168,1);
      }
      piVar8 = &local_168;
      pAVar11 = ar;
LAB_0018c4a8:
      updateReference(pAVar11,&ref,(int)local_148,*piVar8);
    }
    else if (ref_p_s_pos1 - 1U == (uint)local_140) {
      local_148 = 2;
      while (pAVar11 = this, ref_p_s_pos1 <= (int)local_158) {
        noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_p_pos2,&q_p_pos2,&ref_p_s_pos1,
                       piVar8,2);
      }
      goto LAB_0018c4a8;
    }
    uVar9 = this->start1;
    if (ar->start1 < this->start1) {
      uVar9 = ar->start1;
    }
    this->start1 = uVar9;
    uVar9 = this->end2;
    if (this->end2 < ar->end1) {
      uVar9 = ar->end1;
    }
    this->end1 = uVar9;
    this->single_end = true;
    createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i,&nucigar);
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::_M_move_assign
              (&this->cigar1,
               (_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i);
    std::_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~_Vector_base
              ((_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i);
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&i,&dna,&qualities);
    pSVar2 = &this->sequence1;
    ShortDnaSequence::operator=(pSVar2,(ShortDnaSequence *)&i);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&i);
    iVar4 = phred_sum(&qualities,'!');
    this->phred_sum1 = iVar4;
    sVar7 = ShortDnaSequence::size(pSVar2);
    this->length_incl_deletions1 = (int)sVar7;
    sVar7 = ShortDnaSequence::size(pSVar2);
    pvVar1 = local_130;
    this->length_incl_longdeletions1 = (int)sVar7;
    pcVar3 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar3) {
      (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3;
    }
    for (sVar12 = 0; nucigar._M_string_length != sVar12; sVar12 = sVar12 + 1) {
      i = nucigar._M_dataplus._M_p[sVar12];
      std::vector<char,_std::allocator<char>_>::push_back(pvVar1,&i);
    }
  }
  else {
    while (ref_s_pos1 < iVar5) {
      noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,&local_168,1
                    );
    }
    local_148 = 1;
    piVar8 = &ref_rel_pos1;
    while ((uint)ref_s_pos1 <= this->end1) {
      overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_p_pos1,&c_pos1,&q_p_pos1,&q_pos1,
                   &ref_s_pos1,piVar8,1,1);
    }
    local_168 = local_168 + ref_rel_pos1;
    while ((uint)ref_s_pos1 < this->start2) {
      noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,&local_168,1
                    );
    }
    ref_rel_pos1 = 0;
    computeSOffset(pvVar1,&c_p_pos2,&q_p_pos2);
    uVar9 = (uint)local_140;
    if ((int)local_158 < (int)(uint)local_140) {
      uVar9 = local_158;
    }
    while (ref_s_pos1 <= (int)uVar9) {
      overlapMerge(this,&algn,&ref,ar,&dna,&qualities,&nucigar,&c_p_pos2,&c_pos1,&q_p_pos2,&q_pos1,
                   &ref_s_pos1,piVar8,2,1);
    }
    local_168 = local_168 + ref_rel_pos1;
    if (ref_s_pos1 - 1U == local_158) {
      while (ref_s_pos1 <= (int)(uint)local_140) {
        noOverlapMerge(ar,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,&local_168
                       ,1);
      }
      piVar8 = &local_168;
      pAVar11 = ar;
LAB_0018c6e8:
      updateReference(pAVar11,&ref,(int)local_148,*piVar8);
    }
    else if (ref_s_pos1 - 1U == (uint)local_140) {
      local_148 = 2;
      while (pAVar11 = this, ref_s_pos1 <= (int)local_158) {
        noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_p_pos2,&q_p_pos2,&ref_s_pos1,
                       piVar8,2);
      }
      goto LAB_0018c6e8;
    }
    uVar9 = this->start1;
    if (ar->start1 < this->start1) {
      uVar9 = ar->start1;
    }
    this->start1 = uVar9;
    uVar9 = this->end2;
    if (this->end2 < ar->end1) {
      uVar9 = ar->end1;
    }
    this->end1 = uVar9;
    this->single_end = true;
    createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i,&nucigar);
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::_M_move_assign
              (&this->cigar1,
               (_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i);
    std::_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~_Vector_base
              ((_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&i);
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&i,&dna,&qualities);
    pSVar2 = &this->sequence1;
    ShortDnaSequence::operator=(pSVar2,(ShortDnaSequence *)&i);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&i);
    iVar4 = phred_sum(&qualities,'!');
    this->phred_sum1 = iVar4;
    sVar7 = ShortDnaSequence::size(pSVar2);
    this->length_incl_deletions1 = (int)sVar7;
    sVar7 = ShortDnaSequence::size(pSVar2);
    pvVar1 = local_130;
    this->length_incl_longdeletions1 = (int)sVar7;
    pcVar3 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar3) {
      (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3;
    }
    for (sVar12 = 0; nucigar._M_string_length != sVar12; sVar12 = sVar12 + 1) {
      i = nucigar._M_dataplus._M_p[sVar12];
      std::vector<char,_std::allocator<char>_>::push_back(pvVar1,&i);
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->reference_seq1);
  std::__cxx11::string::_M_assign((string *)&this->alignSequence1);
  std::vector<int,std::allocator<int>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<int,std::allocator<int>> *)&this->qualityList1,qualities._M_dataplus._M_p,
             qualities._M_dataplus._M_p + qualities._M_string_length);
LAB_0018c844:
  std::__cxx11::string::~string((string *)&algn);
  std::__cxx11::string::~string((string *)&ref);
  std::__cxx11::string::~string((string *)&nucigar);
  std::__cxx11::string::~string((string *)&qualities);
  std::__cxx11::string::~string((string *)&dna);
  return;
}

Assistant:

void AlignmentRecord::mergeAlignmentRecordsMixed(const AlignmentRecord& ar){
    if(ar.isSingleEnd()){
        std::string dna, qualities, nucigar = "";
        std::string ref = "";
        std::string algn = "";
        int offset_s_f, offset_s_b, offset_p_f1, offset_p_f2, offset_p_b1, offset_p_b2 = 0;
        offset_s_f = computeOffset(ar.getCigar1Unrolled());
        offset_s_b = computeRevOffset(ar.getCigar1Unrolled());
        offset_p_f1 = computeOffset(this->cigar1_unrolled);
        offset_p_f2 = computeOffset(this->cigar2_unrolled);
        offset_p_b1 = computeRevOffset(this->cigar1_unrolled);
        offset_p_b2 = computeRevOffset(this->cigar2_unrolled);
        int ref_s_pos1 = ar.getStart1()-offset_s_f;
        int ref_e_pos1 = ar.getEnd1()+offset_s_b;
        int ref_p_s_pos1 = this->start1-offset_p_f1;
        int ref_p_e_pos1 = this->end1+offset_p_b1;
        int ref_p_s_pos2 = this->start2-offset_p_f2;
        int ref_p_e_pos2 = this->end2+offset_p_b2;
        //position in query sequences // phred scores
        int q_pos1 = 0;
        int q_p_pos1 = 0;
        int q_p_pos2 = 0;
        //position in unrolled cigar vectors
        int c_pos1 = 0;
        int c_p_pos1 = 0;
        int c_p_pos2 = 0;
        //Position in the reference strings
        int ref_rel_pos1 =0;
        int ref_rel_pos2 =0;
        //int i;
        // ---------     -------- ->this (second read not changed)
        //----------
        if(ar.getEnd1() < this->start2){
            mergeAlignmentRecordsSingle(ar,1,1);
            this->single_end = false;
            assert(this->end1 < this->start2);
        } // -------     -------- ->this (second read not changed)
        //             ----------
        else if (ar.getStart1() > this->end1){
            mergeAlignmentRecordsSingle(ar,2,1);
            assert(this->end1 < this->start2);
        } //----------          -----------   ->this OR  -------       -----------
        //-------------------------------              -----------------------------
        else if(ref_s_pos1 <= ref_p_s_pos1){
            while(ref_s_pos1<ref_p_s_pos1){
                ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos1, q_pos1,ref_s_pos1,ref_rel_pos2,1);
            }
            while(ref_s_pos1<=this->end1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_p_pos1,c_pos1,q_p_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,1,1);
            }
            ref_rel_pos2 += ref_rel_pos1;
            while(ref_s_pos1<this->start2){
                ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos2,1);
            }
            ref_rel_pos1 = 0;
            computeSOffset(this->cigar2_unrolled,c_p_pos2,q_p_pos2);
            while(ref_s_pos1<=ref_p_e_pos2 && ref_s_pos1 <= ref_e_pos1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_p_pos2,c_pos1,q_p_pos2,q_pos1,ref_s_pos1,ref_rel_pos1,2,1);
            }
            ref_rel_pos2 += ref_rel_pos1;
            if(ref_s_pos1-1 == ref_p_e_pos2){
                while(ref_s_pos1<=ref_e_pos1){
                    ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos2,1);
                }
                ar.updateReference(ref,1,ref_rel_pos2);
            } else if (ref_s_pos1-1 == ref_e_pos1){
                while(ref_s_pos1<=ref_p_e_pos2){
                    noOverlapMerge(algn,ref,dna,qualities,nucigar,c_p_pos2,q_p_pos2,ref_s_pos1,ref_rel_pos1,2);
                }
                updateReference(ref,2,ref_rel_pos1);
            }
            this->start1=std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd1(),this->end2);
            this->single_end = true;
            this->cigar1=createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(),qualities.end());
        } //----------          ------------ ->this OR ----------       -----------
        //     -------------------------------            ----------------------
        else if(ref_s_pos1 >= ref_p_s_pos1){
            while(ref_p_s_pos1 < ref_s_pos1){
                noOverlapMerge(algn,ref,dna,qualities,nucigar, c_p_pos1,q_p_pos1,ref_p_s_pos1,ref_rel_pos1,1);
            }
            ref_rel_pos2 = ref_rel_pos1;
            while(ref_p_s_pos1<=this->end1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_p_pos1,c_pos1,q_p_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos1,1,1);
            }
            ref_rel_pos2 = ref_rel_pos1 - ref_rel_pos2 ;
            while(ref_p_s_pos1<this->start2){
                ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos2,1);
            }
            ref_rel_pos1 = 0;
            computeSOffset(this->cigar2_unrolled,c_p_pos2,q_p_pos2);
            while(ref_p_s_pos1<=ref_p_e_pos2 && ref_p_s_pos1 <= ref_e_pos1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_p_pos2,c_pos1,q_p_pos2,q_pos1,ref_p_s_pos1,ref_rel_pos1,2,1);
            }
            ref_rel_pos2 += ref_rel_pos1-1;
            if(ref_p_s_pos1-1 == ref_p_e_pos2){
                while(ref_p_s_pos1<=ref_e_pos1){
                    ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos2,1);
                }
                ar.updateReference(ref,1,ref_rel_pos2);
            } else if (ref_p_s_pos1-1 == ref_e_pos1){
                while(ref_p_s_pos1<=ref_p_e_pos2){
                    noOverlapMerge(algn,ref,dna,qualities,nucigar,c_p_pos2,q_p_pos2,ref_p_s_pos1,ref_rel_pos1,2);
                }
                updateReference(ref,2,ref_rel_pos1);
            }
            this->start1=std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd1(),this->end2);
            this->single_end = true;
            this->cigar1=createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(),qualities.end());
        }
    }
    else if (ar.isPairedEnd()){
        std::string dna, qualities, nucigar = "";
        std::string ref = "";
        std::string algn = "";
        int offset_s_f, offset_s_b, offset_p_f1, offset_p_f2, offset_p_b1, offset_p_b2 = 0;
        //get starting position and ending position according to ref position, paying attention to clipped bases
        //updated ref position including clips
        offset_s_f = computeOffset(this->cigar1_unrolled);
        offset_s_b = computeRevOffset(this->cigar1_unrolled);
        offset_p_f1 = computeOffset(ar.getCigar1Unrolled());
        offset_p_f2 = computeOffset(ar.getCigar2Unrolled());
        offset_p_b1 = computeRevOffset(ar.getCigar1Unrolled());
        offset_p_b2 = computeRevOffset(ar.getCigar2Unrolled());
        int ref_s_pos1 = this->start1-offset_s_f;
        int ref_e_pos1 = this->end1+offset_s_b;
        int ref_p_s_pos1 = ar.getStart1()-offset_p_f1;
        //int ref_p_e_pos1 = ar.getEnd1()+offset_p_b1;
        //int ref_p_s_pos2 = ar.getStart2()-offset_p_f2;
        int ref_p_e_pos2 = ar.getEnd2()+offset_p_b2;
        //position in query sequences // phred scores
        int q_pos1 = 0;
        int q_p_pos1 = 0;
        int q_p_pos2 = 0;
        //position in unrolled cigar vectors
        int c_pos1 = 0;
        int c_p_pos1 = 0;
        int c_p_pos2 = 0;
        //Position in the reference strings
        int ref_rel_pos1 =0;
        int ref_rel_pos2 =0;
        // ---------  -----------          OR ---------- ------------
        // ---------               ->this                -------------
        if(this->end1 < ar.getStart2()){
            mergeAlignmentRecordsSingle(ar,1,1);
            this->start2 = ar.getStart2();
            this->end2=ar.getEnd2();
            this->single_end= false;
            this->cigar2 = ar.getCigar2();
            this->sequence2=ar.getSequence2();
            this->phred_sum2=ar.getPhredSum2();
            this->length_incl_deletions2 = ar.getLengthInclDeletions2();
            this->length_incl_longdeletions2 = ar.getLengthInclLongDeletions2();
            this->cigar2_unrolled = ar.getCigar2Unrolled();
            this->reference_seq2 = ar.getReferenceSeq2();
            this->alignSequence2 = ar.getAlignSequence2();
            this->qualityList2 = ar.getQualityList2();
        } else if (this->start1 > ar.getEnd1()){
            mergeAlignmentRecordsSingle(ar,1,2);
            this->start1= ar.getStart1();
            this->end1=ar.getEnd1();
            this->single_end= false;
            this->cigar1 = ar.getCigar1();
            this->sequence1=ar.getSequence1();
            this->phred_sum1=ar.getPhredSum1();
            this->length_incl_deletions1 = ar.getLengthInclDeletions1();
            this->length_incl_longdeletions1 = ar.getLengthInclLongDeletions1();
            this->cigar1_unrolled = ar.getCigar1Unrolled();
            this->reference_seq1 = ar.getReferenceSeq1();
            this->alignSequence1 = ar.getAlignSequence1();
            this->qualityList1 = ar.getQualityList1();
        }//----------          -----------        OR  -------       -----------
        //----------------------------    <-this    -----------------------------
        else if(ref_s_pos1 <= ref_p_s_pos1){
                while(ref_s_pos1<ref_p_s_pos1){
                    noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos1, q_pos1,ref_s_pos1,ref_rel_pos1,1);
                }
                while(ref_s_pos1<=ar.getEnd1()){
                    overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_p_pos1,q_pos1,q_p_pos1,ref_s_pos1,ref_rel_pos1,1,1);
                }
                while(ref_s_pos1<ar.getStart2()){
                    noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,1);
                }
                ref_rel_pos2 = ref_rel_pos1;
                computeSOffset(ar.getCigar2Unrolled(),c_p_pos2,q_p_pos2);

                while(ref_s_pos1<=ref_p_e_pos2 && ref_s_pos1 <=ref_e_pos1){
                    overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_p_pos2,q_pos1,q_p_pos2,ref_s_pos1,ref_rel_pos1,1,2);
                }
                ref_rel_pos2 = ref_rel_pos1 -ref_rel_pos2;
                if(ref_s_pos1-1 == ref_p_e_pos2){
                    while(ref_s_pos1<=ref_e_pos1){
                        noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,1);
                    }
                    updateReference(ref,1,ref_rel_pos1);
                } else if (ref_s_pos1-1 == ref_e_pos1){
                    while(ref_s_pos1<=ref_p_e_pos2){
                        ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_p_pos2,q_p_pos2,ref_s_pos1,ref_rel_pos2,2);
                    }
                    ar.updateReference(ref,2,ref_rel_pos2);
                }
                this->start1=std::min(this->start1,ar.getStart1());
                this->end1=std::max(ar.getEnd2(),this->end1);
                this->single_end = true;
                this->cigar1=createCigar(nucigar);
                this->sequence1=ShortDnaSequence(dna,qualities);
                this->phred_sum1=phred_sum(qualities);
                this->length_incl_deletions1 = this->sequence1.size();
                this->length_incl_longdeletions1 = this->sequence1.size();
                this->cigar1_unrolled.clear();
                for (char i : nucigar){
                    this->cigar1_unrolled.push_back(i);
                }
                this->reference_seq1 = ref;
                this->alignSequence1 = algn;
                this->qualityList1.assign(qualities.begin(), qualities.end());

        }//----------          ------------        OR ----------       -----------
        //     -------------------------------   <-this   ----------------------
        else if(ref_s_pos1 >= ref_p_s_pos1){
            while(ref_p_s_pos1 < ref_s_pos1){
                ar.noOverlapMerge(algn,ref,dna,qualities,nucigar, c_p_pos1,q_p_pos1,ref_p_s_pos1,ref_rel_pos2,1);
            }
            while(ref_p_s_pos1<=ar.getEnd1()){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_p_pos1,q_pos1,q_p_pos1,ref_p_s_pos1,ref_rel_pos1,1,1);
            }

            while(ref_p_s_pos1<ar.getStart2()){
                noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos1,1);
            }
            ref_rel_pos2 = ref_rel_pos1;
            computeSOffset(ar.getCigar2Unrolled(),c_p_pos2,q_p_pos2);
            while(ref_p_s_pos1<=ref_p_e_pos2 && ref_p_s_pos1 <= ref_e_pos1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_p_pos2,q_pos1,q_p_pos2,ref_p_s_pos1,ref_rel_pos1,1,2);
            }
            ref_rel_pos2 = ref_rel_pos1 -1;
            if(ref_p_s_pos1-1 == ref_p_e_pos2){
                while(ref_p_s_pos1<=ref_e_pos1){
                    noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos1,1);
                }
                updateReference(ref,1,ref_rel_pos1);
            } else if (ref_p_s_pos1-1 == ref_e_pos1){
                while(ref_p_s_pos1<=ref_p_e_pos2){
                    ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_p_pos2,q_p_pos2,ref_p_s_pos1,ref_rel_pos2,2);
                }
                ar.updateReference(ref,2,ref_rel_pos2);
            }
            this->start1=std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd2(),this->end1);
            this->single_end = true;
            this->cigar1=createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(), qualities.end());
        }
    }
}